

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O0

string * __thiscall
cmLineBufferStrategy::BufferMessage
          (string *__return_storage_ptr__,cmLineBufferStrategy *this,string *rawBuffer)

{
  size_type sVar1;
  char *pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined8 local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined8 local_50;
  ulong local_48;
  size_type ls;
  allocator local_29;
  long local_28;
  size_type needle;
  string *rawBuffer_local;
  cmLineBufferStrategy *this_local;
  string *line;
  
  needle = (size_type)rawBuffer;
  rawBuffer_local = (string *)this;
  this_local = (cmLineBufferStrategy *)__return_storage_ptr__;
  local_28 = std::__cxx11::string::find((char)rawBuffer,10);
  if (local_28 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    ls._3_1_ = 0;
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,needle);
    local_48 = std::__cxx11::string::size();
    if ((1 < local_48) &&
       (pcVar2 = (char *)std::__cxx11::string::at((ulong)__return_storage_ptr__), *pcVar2 == '\r'))
    {
      std::__cxx11::string::erase((ulong)__return_storage_ptr__,local_48 - 1);
    }
    sVar1 = needle;
    local_58._M_current = (char *)std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_50,&local_58);
    local_78._M_current = (char *)std::__cxx11::string::begin();
    local_70 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_78,local_28);
    local_68 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_70,1);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_60,&local_68);
    std::__cxx11::string::erase(sVar1,local_50,local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BufferMessage(std::string& rawBuffer) override
  {
    auto needle = rawBuffer.find('\n');

    if (needle == std::string::npos) {
      return "";
    }
    std::string line = rawBuffer.substr(0, needle);
    const auto ls = line.size();
    if (ls > 1 && line.at(ls - 1) == '\r') {
      line.erase(ls - 1, 1);
    }
    rawBuffer.erase(rawBuffer.begin(),
                    rawBuffer.begin() + static_cast<long>(needle) + 1);
    return line;
  }